

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm.cpp
# Opt level: O0

int ncnn::lstm(Mat *bottom_blob,Mat *top_blob,int reverse,Mat *weight_xc,Mat *bias_c,Mat *weight_hc,
              Option *opt)

{
  float fVar1;
  bool bVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  float *pfVar14;
  float *pfVar15;
  float *pfVar16;
  Mat *in_RCX;
  int in_EDX;
  Mat *in_RSI;
  Mat *in_RDI;
  Mat *in_R8;
  Mat *in_R9;
  float fVar17;
  float fVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  float H;
  float cell2;
  float G_1;
  float O_1;
  float F_1;
  float I_1;
  float *gates_data_1;
  int q_1;
  float *output_data;
  float h_cont;
  int i_1;
  float xi;
  int i;
  float G;
  float O;
  float F;
  float I;
  float *weight_hc_G;
  float *weight_hc_O;
  float *weight_hc_F;
  float *weight_hc_I;
  float *weight_xc_G;
  float *weight_xc_O;
  float *weight_xc_F;
  float *weight_xc_I;
  float *gates_data;
  float *bias_c_G;
  float *bias_c_O;
  float *bias_c_F;
  float *bias_c_I;
  int q;
  float *x;
  int ti;
  int cont;
  int t;
  Mat gates;
  Mat cell;
  Mat hidden;
  int num_output;
  int T;
  int size;
  undefined4 in_stack_fffffffffffffd18;
  undefined4 in_stack_fffffffffffffd1c;
  Mat *in_stack_fffffffffffffd20;
  int in_stack_fffffffffffffd28;
  float in_stack_fffffffffffffd2c;
  Mat *in_stack_fffffffffffffd30;
  float local_2a4;
  float local_284;
  int local_208;
  int local_1cc;
  int local_1bc;
  int local_1b4;
  float local_1b0;
  float local_1ac;
  float local_1a8;
  float local_1a4;
  int local_134;
  int local_11c;
  Mat local_118;
  Mat local_d8;
  undefined4 local_98;
  Mat local_88;
  int local_44;
  int local_40;
  int local_3c;
  Mat *local_38;
  Mat *local_30;
  Mat *local_28;
  int local_1c;
  Mat *local_18;
  Mat *local_10;
  int local_4;
  
  local_3c = in_RDI->w;
  local_40 = in_RDI->h;
  local_44 = in_RSI->w;
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_1c = in_EDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  Mat::Mat(in_stack_fffffffffffffd30,(int)in_stack_fffffffffffffd2c,
           (size_t)in_stack_fffffffffffffd20,
           (Allocator *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
  bVar2 = Mat::empty(in_stack_fffffffffffffd20);
  if (bVar2) {
    local_4 = -100;
    local_98 = 1;
  }
  else {
    Mat::Mat(in_stack_fffffffffffffd30,(int)in_stack_fffffffffffffd2c,
             (size_t)in_stack_fffffffffffffd20,
             (Allocator *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
    bVar2 = Mat::empty(in_stack_fffffffffffffd20);
    if (bVar2) {
      local_4 = -100;
      local_98 = 1;
    }
    else {
      Mat::Mat(in_stack_fffffffffffffd30,(int)in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28,
               (size_t)in_stack_fffffffffffffd20,
               (Allocator *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
      bVar2 = Mat::empty(in_stack_fffffffffffffd20);
      if (bVar2) {
        local_4 = -100;
      }
      else {
        Mat::fill(in_stack_fffffffffffffd30,in_stack_fffffffffffffd2c);
        Mat::fill(in_stack_fffffffffffffd30,in_stack_fffffffffffffd2c);
        for (local_11c = 0; local_11c < local_40; local_11c = local_11c + 1) {
          if (local_1c == 0) {
            local_208 = local_11c;
          }
          else {
            local_208 = (local_40 + -1) - local_11c;
          }
          pfVar3 = Mat::row(local_10,local_208);
          for (local_134 = 0; local_134 < local_44; local_134 = local_134 + 1) {
            pfVar4 = Mat::row(local_30,0);
            pfVar5 = Mat::row(local_30,1);
            pfVar6 = Mat::row(local_30,2);
            pfVar7 = Mat::row(local_30,3);
            pfVar8 = Mat::row(&local_118,local_134);
            pfVar9 = Mat::row(local_28,local_134);
            pfVar10 = Mat::row(local_28,local_44 + local_134);
            pfVar11 = Mat::row(local_28,local_134 + local_44 * 2);
            pfVar12 = Mat::row(local_28,local_44 * 3 + local_134);
            pfVar13 = Mat::row(local_38,local_134);
            pfVar14 = Mat::row(local_38,local_44 + local_134);
            pfVar15 = Mat::row(local_38,local_134 + local_44 * 2);
            pfVar16 = Mat::row(local_38,local_44 * 3 + local_134);
            local_1a4 = pfVar4[local_134];
            local_1a8 = pfVar5[local_134];
            local_1ac = pfVar6[local_134];
            local_1b0 = pfVar7[local_134];
            for (local_1b4 = 0; local_1b4 < local_3c; local_1b4 = local_1b4 + 1) {
              fVar17 = pfVar3[local_1b4];
              local_1a4 = pfVar9[local_1b4] * fVar17 + local_1a4;
              local_1a8 = pfVar10[local_1b4] * fVar17 + local_1a8;
              local_1ac = pfVar11[local_1b4] * fVar17 + local_1ac;
              local_1b0 = pfVar12[local_1b4] * fVar17 + local_1b0;
            }
            for (local_1bc = 0; local_1bc < local_44; local_1bc = local_1bc + 1) {
              if (local_11c < 1) {
                local_284 = 0.0;
              }
              else {
                pfVar4 = Mat::operator[](&local_88,(long)local_1bc);
                local_284 = *pfVar4;
              }
              local_1a4 = pfVar13[local_1bc] * local_284 + local_1a4;
              local_1a8 = pfVar14[local_1bc] * local_284 + local_1a8;
              local_1ac = pfVar15[local_1bc] * local_284 + local_1ac;
              local_1b0 = pfVar16[local_1bc] * local_284 + local_1b0;
            }
            *pfVar8 = local_1a4;
            pfVar8[1] = local_1a8;
            pfVar8[2] = local_1ac;
            pfVar8[3] = local_1b0;
          }
          pfVar3 = Mat::row(local_18,local_208);
          for (local_1cc = 0; local_1cc < local_44; local_1cc = local_1cc + 1) {
            pfVar4 = Mat::row(&local_118,local_1cc);
            fVar17 = pfVar4[1];
            fVar18 = pfVar4[2];
            fVar1 = pfVar4[3];
            dVar19 = std::exp((double)((ulong)(uint)*pfVar4 ^ 0x8000000080000000));
            if (local_11c < 1) {
              local_2a4 = 0.0;
            }
            else {
              dVar20 = std::exp((double)((ulong)(uint)fVar17 ^ 0x8000000080000000));
              local_2a4 = 1.0 / (SUB84(dVar20,0) + 1.0);
            }
            dVar20 = std::exp((double)((ulong)(uint)fVar18 ^ 0x8000000080000000));
            dVar21 = std::tanh((double)(ulong)(uint)fVar1);
            pfVar4 = Mat::operator[](&local_d8,(long)local_1cc);
            fVar17 = local_2a4 * *pfVar4 + (1.0 / (SUB84(dVar19,0) + 1.0)) * SUB84(dVar21,0);
            dVar19 = std::tanh((double)(ulong)(uint)fVar17);
            fVar18 = (1.0 / (SUB84(dVar20,0) + 1.0)) * SUB84(dVar19,0);
            pfVar4 = Mat::operator[](&local_d8,(long)local_1cc);
            *pfVar4 = fVar17;
            fVar17 = fVar18;
            pfVar4 = Mat::operator[](&local_88,(long)local_1cc);
            *pfVar4 = fVar17;
            pfVar3[local_1cc] = fVar18;
          }
        }
        local_4 = 0;
      }
      local_98 = 1;
      Mat::~Mat((Mat *)0x179a44);
    }
    Mat::~Mat((Mat *)0x179a51);
  }
  Mat::~Mat((Mat *)0x179a6f);
  return local_4;
}

Assistant:

static int lstm(const Mat& bottom_blob, Mat& top_blob, int reverse, const Mat& weight_xc, const Mat& bias_c, const Mat& weight_hc, const Option& opt)
{
    int size = bottom_blob.w;
    int T = bottom_blob.h;

    int num_output = top_blob.w;

    // initial hidden state
    Mat hidden(num_output, 4u, opt.workspace_allocator);
    if (hidden.empty())
        return -100;

    // internal cell state
    Mat cell(num_output, 4u, opt.workspace_allocator);
    if (cell.empty())
        return -100;

    // 4 x num_output
    Mat gates(4, num_output, 4u, opt.workspace_allocator);
    if (gates.empty())
        return -100;

    hidden.fill(0.f);
    cell.fill(0.f);

    // unroll
    for (int t=0; t<T; t++)
    {
        // clip hidden by continuation indicator
        // h_cont_{t-1} = cont_t * h_{t-1}
        // h_cont_{t-1} = h_{t-1} if cont_t == 1
        //                0       otherwise
        // calculate hidden
        // gate_input_t := W_hc * h_conted_{t-1} + W_xc * x_t + b_c
        int cont = t > 0;

        int ti = reverse ? T-1-t : t;

        const float* x = bottom_blob.row(ti);
        for (int q=0; q<num_output; q++)
        {
            const float* bias_c_I = bias_c.row(0);
            const float* bias_c_F = bias_c.row(1);
            const float* bias_c_O = bias_c.row(2);
            const float* bias_c_G = bias_c.row(3);

            float* gates_data = gates.row(q);

            // gate I F O G
            const float* weight_xc_I = weight_xc.row(num_output * 0 + q);
            const float* weight_xc_F = weight_xc.row(num_output * 1 + q);
            const float* weight_xc_O = weight_xc.row(num_output * 2 + q);
            const float* weight_xc_G = weight_xc.row(num_output * 3 + q);

            const float* weight_hc_I = weight_hc.row(num_output * 0 + q);
            const float* weight_hc_F = weight_hc.row(num_output * 1 + q);
            const float* weight_hc_O = weight_hc.row(num_output * 2 + q);
            const float* weight_hc_G = weight_hc.row(num_output * 3 + q);

            float I = bias_c_I[q];
            float F = bias_c_F[q];
            float O = bias_c_O[q];
            float G = bias_c_G[q];

            for (int i=0; i<size; i++)
            {
                float xi = x[i];

                I += weight_xc_I[i] * xi;
                F += weight_xc_F[i] * xi;
                O += weight_xc_O[i] * xi;
                G += weight_xc_G[i] * xi;
            }

            for (int i=0; i<num_output; i++)
            {
                float h_cont = cont ? hidden[i] : 0.f;

                I += weight_hc_I[i] * h_cont;
                F += weight_hc_F[i] * h_cont;
                O += weight_hc_O[i] * h_cont;
                G += weight_hc_G[i] * h_cont;
            }

            gates_data[0] = I;
            gates_data[1] = F;
            gates_data[2] = O;
            gates_data[3] = G;
        }

        // lstm unit
        // sigmoid(I)
        // sigmoid(F)
        // sigmoid(O)
        // tanh(G)
        // c_t := f_t .* c_{t-1} + i_t .* g_t
        // h_t := o_t .* tanh[c_t]
        float* output_data = top_blob.row(ti);
        for (int q=0; q<num_output; q++)
        {
            const float* gates_data = gates.row(q);

            float I = gates_data[0];
            float F = gates_data[1];
            float O = gates_data[2];
            float G = gates_data[3];

            I = 1.f / (1.f + exp(-I));
            F = cont ? 1.f / (1.f + exp(-F)) : 0.f;
            O = 1.f / (1.f + exp(-O));
            G = tanh(G);

            float cell2 = F * cell[q] + I * G;
            float H = O * tanh(cell2);
            cell[q] = cell2;
            hidden[q] = H;
            output_data[q] = H;
        }

        // no cell output here
    }

    return 0;
}